

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::find_layer_index_by_name(Net *this,char *name)

{
  pointer ppLVar1;
  int iVar2;
  int unaff_EBP;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  ppLVar1 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  bVar5 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppLVar1;
  if (bVar5) {
    iVar2 = std::__cxx11::string::compare((char *)&(*ppLVar1)->name);
    uVar3 = 0;
    unaff_EBP = 0;
    if (iVar2 != 0) {
      uVar4 = 1;
      do {
        unaff_EBP = (int)uVar3;
        ppLVar1 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar5 = uVar4 < (ulong)((long)(this->layers).
                                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >>
                               3);
        if (!bVar5) break;
        iVar2 = std::__cxx11::string::compare((char *)&ppLVar1[uVar4]->name);
        if (iVar2 == 0) {
          uVar3 = uVar4 & 0xffffffff;
        }
        unaff_EBP = (int)uVar3;
        uVar4 = uVar4 + 1;
      } while (iVar2 != 0);
    }
  }
  if (!bVar5) {
    fprintf(_stderr,"find_layer_index_by_name %s failed\n",name);
    unaff_EBP = -1;
  }
  return unaff_EBP;
}

Assistant:

int Net::find_layer_index_by_name(const char* name) const
{
    for (size_t i=0; i<layers.size(); i++)
    {
        const Layer* layer = layers[i];
        if (layer->name == name)
        {
            return i;
        }
    }

    fprintf(stderr, "find_layer_index_by_name %s failed\n", name);
    return -1;
}